

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O2

uchar flatbuffers::GetFieldI<unsigned_char>(Table *table,Field *field)

{
  uchar uVar1;
  uint16_t field_00;
  BaseType BVar2;
  Type *this;
  int64_t iVar3;
  
  this = reflection::Field::type(field);
  BVar2 = reflection::Type::base_type(this);
  if (*(long *)(GetTypeSize(reflection::BaseType)::sizes + (ulong)BVar2 * 8) == 1) {
    field_00 = reflection::Field::offset(field);
    iVar3 = reflection::Field::default_integer(field);
    uVar1 = Table::GetField<unsigned_char>(table,field_00,(uchar)iVar3);
    return uVar1;
  }
  __assert_fail("sizeof(T) == GetTypeSize(field.type()->base_type())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                ,0x7b,
                "T flatbuffers::GetFieldI(const Table &, const reflection::Field &) [T = unsigned char]"
               );
}

Assistant:

T GetFieldI(const Table &table, const reflection::Field &field) {
  FLATBUFFERS_ASSERT(sizeof(T) == GetTypeSize(field.type()->base_type()));
  return table.GetField<T>(field.offset(),
                           static_cast<T>(field.default_integer()));
}